

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcActuatorType::IfcActuatorType(IfcActuatorType *this)

{
  *(undefined ***)&this->field_0x1d0 = &PTR__Object_008a0070;
  *(undefined8 *)&this->field_0x1d8 = 0;
  *(char **)&this->field_0x1e0 = "IfcActuatorType";
  IfcDistributionControlElementType::IfcDistributionControlElementType
            (&this->super_IfcDistributionControlElementType,&PTR_construction_vtable_24__0090e8a0);
  *(undefined8 *)&(this->super_IfcDistributionControlElementType).field_0x1a8 = 0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x90e748;
  *(undefined8 *)&this->field_0x1d0 = 0x90e888;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x90e770;
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x90e798;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x90e7c0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0x90e7e8;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x180 = 0x90e810;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x90e838;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.field_0x1a0 =
       0x90e860;
  *(undefined1 **)&(this->super_IfcDistributionControlElementType).field_0x1b0 = &this->field_0x1c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  this->field_0x1c0 = 0;
  return;
}

Assistant:

IfcActuatorType() : Object("IfcActuatorType") {}